

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::mousePressEvent(QTreeView *this,QMouseEvent *event)

{
  long lVar1;
  int iVar2;
  QTreeViewPrivate *pQVar3;
  QStyle *pQVar4;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  bool handled;
  QTreeViewPrivate *d;
  QWidget *in_stack_ffffffffffffff68;
  QTreeViewPrivate *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  byte bVar6;
  QPoint *in_stack_ffffffffffffffb0;
  QTreeViewPrivate *in_stack_ffffffffffffffb8;
  QPointF in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QTreeView *)0x8f8f25);
  bVar6 = 0;
  pQVar4 = QWidget::style(in_stack_ffffffffffffff68);
  iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x28,0,in_RDI);
  if (iVar2 == 2) {
    in_stack_ffffffffffffff80 = pQVar3;
    QSinglePointEvent::position((QSinglePointEvent *)0x8f8f70);
    QPointF::toPoint((QPointF *)in_stack_ffffffffffffff80);
    bVar6 = QTreeViewPrivate::expandOrCollapseItemAtPos
                      ((QTreeViewPrivate *)CONCAT17(bVar6,in_stack_ffffffffffffff90),in_RDI);
  }
  bVar5 = false;
  if ((bVar6 & 1) == 0) {
    in_stack_ffffffffffffffc8 = QSinglePointEvent::position((QSinglePointEvent *)0x8f8fca);
    QPointF::toPoint((QPointF *)in_stack_ffffffffffffff80);
    iVar2 = QTreeViewPrivate::itemDecorationAt(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    bVar5 = iVar2 == -1;
  }
  if (bVar5) {
    QAbstractItemView::mousePressEvent
              ((QAbstractItemView *)in_stack_ffffffffffffffc8.yp,
               (QMouseEvent *)in_stack_ffffffffffffffc8.xp);
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x8f9023);
    QPersistentModelIndex::operator=
              (&(pQVar3->super_QAbstractItemViewPrivate).pressedIndex,
               (QModelIndex *)&stack0xffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    bool handled = false;
    if (style()->styleHint(QStyle::SH_ListViewExpand_SelectMouseType, nullptr, this) == QEvent::MouseButtonPress)
        handled = d->expandOrCollapseItemAtPos(event->position().toPoint());
    if (!handled && d->itemDecorationAt(event->position().toPoint()) == -1)
        QAbstractItemView::mousePressEvent(event);
    else
        d->pressedIndex = QModelIndex();
}